

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::is_inactive_internal(torrent *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  session_settings *psVar4;
  torrent *this_local;
  
  bVar1 = is_finished(this);
  if (bVar1) {
    iVar2 = stat::upload_payload_rate(&this->m_stat);
    psVar4 = settings(this);
    iVar3 = session_settings::get_int(psVar4,0x407a);
    this_local._7_1_ = iVar2 < iVar3;
  }
  else {
    iVar2 = stat::download_payload_rate(&this->m_stat);
    psVar4 = settings(this);
    iVar3 = session_settings::get_int(psVar4,0x4079);
    this_local._7_1_ = iVar2 < iVar3;
  }
  return this_local._7_1_;
}

Assistant:

bool torrent::is_inactive_internal() const
	{
		if (is_finished())
			return m_stat.upload_payload_rate()
				< settings().get_int(settings_pack::inactive_up_rate);
		else
			return m_stat.download_payload_rate()
				< settings().get_int(settings_pack::inactive_down_rate);
	}